

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

const_iterator * __thiscall
QMultiHash<int,_int>::constFindImpl<int>
          (const_iterator *__return_storage_ptr__,QMultiHash<int,_int> *this,int *key)

{
  Span *pSVar1;
  ulong uVar2;
  Bucket BVar3;
  
  if (this->m_size != 0) {
    uVar2 = (long)*key ^ this->d->seed;
    uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
    uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
    BVar3 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::findBucketWithHash<int>
                      (this->d,key,uVar2 >> 0x20 ^ uVar2);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pSVar1 = this->d->spans;
      uVar2 = ((ulong)((long)BVar3.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar3.index;
      (__return_storage_ptr__->i).d = this->d;
      (__return_storage_ptr__->i).bucket = uVar2;
      uVar2 = uVar2 >> 7;
      __return_storage_ptr__->e =
           (Chain **)
           (pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)BVar3.index & 0x7f]].storage.data + 8)
      ;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->i).d = (Data<QHashPrivate::MultiNode<int,_int>_> *)0x0;
  (__return_storage_ptr__->i).bucket = 0;
  __return_storage_ptr__->e = (Chain **)0x0;
  return __return_storage_ptr__;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return constEnd();
        return const_iterator(it.toIterator(d));
    }